

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_diff_equivnode(lyd_node *first,lyd_node *second)

{
  lys_node *plVar1;
  lys_node *plVar2;
  int iVar3;
  
  if (second != (lyd_node *)0x0 && first != (lyd_node *)0x0) {
    do {
      plVar1 = first->schema;
      plVar2 = second->schema;
      if (plVar1->module->ctx == plVar2->module->ctx) {
        if (plVar1 != plVar2) {
          return 0;
        }
      }
      else {
        iVar3 = ly_strequal_(plVar1->name,plVar2->name);
        if (iVar3 == 0) {
          return 0;
        }
      }
      if ((first->schema->nodetype == LYS_LIST) &&
         (iVar3 = lyd_list_equal(first,second,0), iVar3 != 1)) {
        return 0;
      }
      first = first->parent;
      second = second->parent;
    } while ((first != (lyd_node *)0x0) && (second != (lyd_node *)0x0));
  }
  return (uint)(first == second);
}

Assistant:

static int
lyd_diff_equivnode(struct lyd_node *first, struct lyd_node *second)
{
    struct lyd_node *iter1, *iter2;

    for (iter1 = first, iter2 = second; iter1 && iter2; iter1 = iter1->parent, iter2 = iter2->parent) {
        if (iter1->schema->module->ctx == iter2->schema->module->ctx) {
            if (iter1->schema != iter2->schema) {
                return 0;
            }
        } else {
            if (!ly_strequal(iter1->schema->name, iter2->schema->name, 0)) {
                /* comparing the names is fine, even if they are, in fact, 2 different nodes
                 * with equal names, some of their parents will differ */
                return 0;
            }
        }
        if (iter1->schema->nodetype == LYS_LIST) {
            /* compare keys */
            if (lyd_list_equal(iter1, iter2, 0) != 1) {
                return 0;
            }
        }
    }

    if (iter1 != iter2) {
        /* we are supposed to be in root (NULL) in both trees */
        return 0;
    }

    return 1;
}